

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slicing.h
# Opt level: O0

void __thiscall
dg::Slicer<dg::LLVMNode>::sliceBBlocks
          (Slicer<dg::LLVMNode> *this,DependenceGraph<dg::LLVMNode> *graph,uint32_t sl_id)

{
  bool bVar1;
  reference ppVar2;
  uint64_t uVar3;
  reference ppBVar4;
  size_t sVar5;
  ulong uVar6;
  uint in_EDX;
  DependenceGraph<dg::LLVMNode> *in_RSI;
  map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
  *in_RDI;
  pair<std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*>,_bool> pVar7;
  BBlock<dg::LLVMNode> *blk;
  iterator __end0_1;
  iterator __begin0_1;
  set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
  *__range2_1;
  pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*> *it;
  iterator __end0;
  iterator __begin0;
  BBlocksMapT *__range2;
  set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
  blocks;
  BBlocksMapT *CB;
  _Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>
  *in_stack_ffffffffffffff60;
  BBlock<dg::LLVMNode> *this_00;
  _Self local_98;
  _Self local_90;
  value_type *in_stack_ffffffffffffff78;
  _Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*> in_stack_ffffffffffffff80;
  _Self local_68;
  _Self local_60;
  BBlocksMapT *local_58;
  BBlocksMapT *local_20;
  uint local_14;
  
  local_14 = in_EDX;
  local_20 = DependenceGraph<dg::LLVMNode>::getBlocks(in_RSI);
  std::
  set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
  ::set((set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
         *)0x1adea9);
  local_58 = local_20;
  local_60._M_node =
       (_Base_ptr)
       std::
       map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
       ::begin(in_RDI);
  local_68._M_node =
       (_Base_ptr)
       std::
       map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
       ::end(in_RDI);
  while (bVar1 = std::operator!=(&local_60,&local_68), bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>::
             operator*((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>
                        *)0x1adef3);
    uVar3 = BBlock<dg::LLVMNode>::getSlice(ppVar2->second);
    if (uVar3 != local_14) {
      pVar7 = std::
              set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
              ::insert((set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                        *)in_stack_ffffffffffffff80._M_node,in_stack_ffffffffffffff78);
      in_stack_ffffffffffffff80 = pVar7.first._M_node;
    }
    std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>::operator++
              (in_stack_ffffffffffffff60);
  }
  local_90._M_node =
       (_Base_ptr)
       std::
       set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
       ::begin((set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                *)in_RDI);
  local_98._M_node =
       (_Base_ptr)
       std::
       set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
       ::end((set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
              *)in_RDI);
  while (bVar1 = std::operator!=(&local_90,&local_98), bVar1) {
    ppBVar4 = std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*>::operator*
                        ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*> *)0x1adf83);
    this_00 = *ppBVar4;
    sVar5 = BBlock<dg::LLVMNode>::size((BBlock<dg::LLVMNode> *)0x1adf95);
    ((set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
      *)in_RDI)[1]._M_t._M_impl.super__Rb_tree_header._M_node_count =
         sVar5 + ((set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                   *)in_RDI)[1]._M_t._M_impl.super__Rb_tree_header._M_node_count;
    sVar5 = BBlock<dg::LLVMNode>::size((BBlock<dg::LLVMNode> *)0x1adfae);
    ((set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
      *)in_RDI)[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)
         ((long)&(((set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                    *)in_RDI)[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right)->_M_color +
         sVar5);
    *(int *)&((set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
               *)in_RDI)[2]._M_t._M_impl =
         *(int *)&((set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                    *)in_RDI)[2]._M_t._M_impl + 1;
    uVar6 = (**(code **)(*(long *)&(((set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
                                      *)in_RDI)->_M_t)._M_impl + 8))(in_RDI,this_00);
    if ((uVar6 & 1) != 0) {
      BBlock<dg::LLVMNode>::remove(this_00,(char *)0x1);
    }
    std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*>::operator++
              ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*> *)this_00);
  }
  std::
  set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
  ::~set((set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
          *)0x1adffe);
  return;
}

Assistant:

void sliceBBlocks(DependenceGraph<NodeT> *graph, uint32_t sl_id) {
        auto &CB = graph->getBlocks();
#ifndef NDEBUG
        uint32_t blocksNum = CB.size();
#endif
        // gather the blocks
        // FIXME: we don't need two loops, just go carefully
        // through the constructed blocks (keep temporary always-valid iterator)
        std::set<BBlock<NodeT> *> blocks;
        for (auto &it : CB) {
            if (it.second->getSlice() != sl_id)
                blocks.insert(it.second);
        }

        for (BBlock<NodeT> *blk : blocks) {
            // update statistics
            statistics.nodesRemoved += blk->size();
            statistics.nodesTotal += blk->size();
            ++statistics.blocksRemoved;

            // call specific handlers (overriden by child class)
            if (removeBlock(blk)) {
                // remove block from the graph
                blk->remove();
            }
        }

        assert(CB.size() + blocks.size() == blocksNum &&
               "Inconsistency in sliced blocks");
    }